

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

bool __thiscall
slang::ast::AssertionExpr::visit<slang::ast::ConstraintExprVisitor>
          (AssertionExpr *this,ConstraintExprVisitor *visitor)

{
  logic_error *this_00;
  string local_f8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ConstraintExprVisitor *local_20;
  ConstraintExprVisitor *visitor_local;
  AssertionExpr *this_local;
  
  local_20 = visitor;
  visitor_local = (ConstraintExprVisitor *)this;
  switch(this->kind) {
  case Invalid:
    this_local._7_1_ = ConstraintExprVisitor::visitInvalid(visitor,this);
    break;
  case Simple:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::SimpleAssertionExpr>
                   (visitor,(SimpleAssertionExpr *)this);
    break;
  case SequenceConcat:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::SequenceConcatExpr>
                   (visitor,(SequenceConcatExpr *)this);
    break;
  case SequenceWithMatch:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::SequenceWithMatchExpr>
                   (visitor,(SequenceWithMatchExpr *)this);
    break;
  case Unary:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::UnaryAssertionExpr>
                   (visitor,(UnaryAssertionExpr *)this);
    break;
  case Binary:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::BinaryAssertionExpr>
                   (visitor,(BinaryAssertionExpr *)this);
    break;
  case FirstMatch:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::FirstMatchAssertionExpr>
                   (visitor,(FirstMatchAssertionExpr *)this);
    break;
  case Clocking:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::ClockingAssertionExpr>
                   (visitor,(ClockingAssertionExpr *)this);
    break;
  case StrongWeak:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::StrongWeakAssertionExpr>
                   (visitor,(StrongWeakAssertionExpr *)this);
    break;
  case Abort:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::AbortAssertionExpr>
                   (visitor,(AbortAssertionExpr *)this);
    break;
  case Conditional:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::ConditionalAssertionExpr>
                   (visitor,(ConditionalAssertionExpr *)this);
    break;
  case Case:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::CaseAssertionExpr>
                   (visitor,(CaseAssertionExpr *)this);
    break;
  case DisableIff:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::DisableIffAssertionExpr>
                   (visitor,(DisableIffAssertionExpr *)this);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_c1);
    std::operator+(&local_a0,&local_c0,":");
    std::__cxx11::to_string(&local_f8,0x199);
    std::operator+(&local_80,&local_a0,&local_f8);
    std::operator+(&local_60,&local_80,": ");
    std::operator+(&local_40,&local_60,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return this_local._7_1_;
}

Assistant:

decltype(auto) AssertionExpr::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case AssertionExprKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case AssertionExprKind::Invalid: return visitor.visitInvalid(*this, std::forward<Args>(args)...);
        CASE(Simple, SimpleAssertionExpr);
        CASE(SequenceConcat, SequenceConcatExpr);
        CASE(SequenceWithMatch, SequenceWithMatchExpr);
        CASE(Unary, UnaryAssertionExpr);
        CASE(Binary, BinaryAssertionExpr);
        CASE(FirstMatch, FirstMatchAssertionExpr);
        CASE(Clocking, ClockingAssertionExpr);
        CASE(StrongWeak, StrongWeakAssertionExpr);
        CASE(Abort, AbortAssertionExpr);
        CASE(Conditional, ConditionalAssertionExpr);
        CASE(Case, CaseAssertionExpr);
        CASE(DisableIff, DisableIffAssertionExpr);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}